

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O2

void __thiscall VariableAndMod::VariableAndMod(VariableAndMod *this,string *name,string *mods)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->modifiers,(string *)mods);
  return;
}

Assistant:

VariableAndMod(string name, string mods)
      : variable_name(name), modifiers(mods) { }